

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coincontrol.cpp
# Opt level: O0

vector<COutPoint,_std::allocator<COutPoint>_> * __thiscall
wallet::CCoinControl::ListSelected(CCoinControl *this)

{
  long lVar1;
  const_iterator cVar2;
  const_iterator cVar3;
  back_insert_iterator<std::vector<COutPoint,_std::allocator<COutPoint>_>_> bVar4;
  vector<COutPoint,_std::allocator<COutPoint>_> *in_RDI;
  long in_FS_OFFSET;
  vector<COutPoint,_std::allocator<COutPoint>_> *outpoints;
  vector<COutPoint,_std::allocator<COutPoint>_> *in_stack_ffffffffffffff78;
  map<COutPoint,_wallet::PreselectedInput,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_wallet::PreselectedInput>_>_>
  *in_stack_ffffffffffffff80;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<COutPoint,_std::allocator<COutPoint>_>::vector(in_stack_ffffffffffffff78);
  cVar2 = std::
          map<COutPoint,_wallet::PreselectedInput,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_wallet::PreselectedInput>_>_>
          ::begin(in_stack_ffffffffffffff80);
  cVar3 = std::
          map<COutPoint,_wallet::PreselectedInput,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_wallet::PreselectedInput>_>_>
          ::end(in_stack_ffffffffffffff80);
  bVar4 = std::back_inserter<std::vector<COutPoint,std::allocator<COutPoint>>>
                    ((vector<COutPoint,_std::allocator<COutPoint>_> *)in_stack_ffffffffffffff80);
  std::
  transform<std::_Rb_tree_const_iterator<std::pair<COutPoint_const,wallet::PreselectedInput>>,std::back_insert_iterator<std::vector<COutPoint,std::allocator<COutPoint>>>,wallet::CCoinControl::ListSelected()const::__0>
            (cVar2._M_node,cVar3._M_node,bVar4.container);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

std::vector<COutPoint> CCoinControl::ListSelected() const
{
    std::vector<COutPoint> outpoints;
    std::transform(m_selected.begin(), m_selected.end(), std::back_inserter(outpoints),
        [](const std::map<COutPoint, PreselectedInput>::value_type& pair) {
            return pair.first;
        });
    return outpoints;
}